

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int read_StreamsInfo(archive_read *a,_7z_stream_info *si)

{
  void *pvVar1;
  _7z_folder *p_Var2;
  int iVar3;
  _7z_folder *f;
  ulong uStack_40;
  uint32_t packIndex;
  uint64_t packPos;
  uchar *puStack_30;
  uint i;
  uchar *p;
  _7zip *zip;
  _7z_stream_info *si_local;
  archive_read *a_local;
  
  pvVar1 = a->format->data;
  memset(si,0,0x68);
  puStack_30 = header_bytes(a,1);
  if (puStack_30 == (uchar *)0x0) {
    return -1;
  }
  if (*puStack_30 == '\x06') {
    iVar3 = read_PackInfo(a,&si->pi);
    if (iVar3 < 0) {
      return -1;
    }
    if (((si->pi).positions == (uint64_t *)0x0) || ((si->pi).sizes == (uint64_t *)0x0)) {
      return -1;
    }
    uStack_40 = (si->pi).pos;
    for (packPos._4_4_ = 0; (ulong)packPos._4_4_ < (si->pi).numPackStreams;
        packPos._4_4_ = packPos._4_4_ + 1) {
      (si->pi).positions[packPos._4_4_] = uStack_40;
      uStack_40 = (si->pi).sizes[packPos._4_4_] + uStack_40;
      if (*(ulong *)((long)pvVar1 + 0x80) < uStack_40) {
        return -1;
      }
    }
    puStack_30 = header_bytes(a,1);
    if (puStack_30 == (uchar *)0x0) {
      return -1;
    }
  }
  if (*puStack_30 == '\a') {
    iVar3 = read_CodersInfo(a,&si->ci);
    if (iVar3 < 0) {
      return -1;
    }
    f._4_4_ = 0;
    p_Var2 = (si->ci).folders;
    for (packPos._4_4_ = 0; (ulong)packPos._4_4_ < (si->ci).numFolders;
        packPos._4_4_ = packPos._4_4_ + 1) {
      p_Var2[packPos._4_4_].packIndex = f._4_4_;
      f._4_4_ = (int)p_Var2[packPos._4_4_].numPackedStreams + f._4_4_;
      if ((si->pi).numPackStreams < (ulong)f._4_4_) {
        return -1;
      }
    }
    puStack_30 = header_bytes(a,1);
    if (puStack_30 == (uchar *)0x0) {
      return -1;
    }
  }
  if (*puStack_30 == '\b') {
    iVar3 = read_SubStreamsInfo(a,&si->ss,(si->ci).folders,(si->ci).numFolders);
    if (iVar3 < 0) {
      return -1;
    }
    puStack_30 = header_bytes(a,1);
    if (puStack_30 == (uchar *)0x0) {
      return -1;
    }
  }
  if (*puStack_30 == '\0') {
    a_local._4_4_ = 0;
  }
  else {
    a_local._4_4_ = -1;
  }
  return a_local._4_4_;
}

Assistant:

static int
read_StreamsInfo(struct archive_read *a, struct _7z_stream_info *si)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const unsigned char *p;
	unsigned i;

	memset(si, 0, sizeof(*si));

	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	if (*p == kPackInfo) {
		uint64_t packPos;

		if (read_PackInfo(a, &(si->pi)) < 0)
			return (-1);

		if (si->pi.positions == NULL || si->pi.sizes == NULL)
			return (-1);
		/*
		 * Calculate packed stream positions.
		 */
		packPos = si->pi.pos;
		for (i = 0; i < si->pi.numPackStreams; i++) {
			si->pi.positions[i] = packPos;
			packPos += si->pi.sizes[i];
			if (packPos > zip->header_offset)
				return (-1);
		}
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}
	if (*p == kUnPackInfo) {
		uint32_t packIndex;
		struct _7z_folder *f;

		if (read_CodersInfo(a, &(si->ci)) < 0)
			return (-1);

		/*
		 * Calculate packed stream indexes.
		 */
		packIndex = 0;
		f = si->ci.folders;
		for (i = 0; i < si->ci.numFolders; i++) {
			f[i].packIndex = packIndex;
			packIndex += (uint32_t)f[i].numPackedStreams;
			if (packIndex > si->pi.numPackStreams)
				return (-1);
		}
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}

	if (*p == kSubStreamsInfo) {
		if (read_SubStreamsInfo(a, &(si->ss),
		    si->ci.folders, (size_t)si->ci.numFolders) < 0)
			return (-1);
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}

	/*
	 *  Must be kEnd.
	 */
	if (*p != kEnd)
		return (-1);
	return (0);
}